

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_print.c
# Opt level: O0

int fmtstr(char **sbuffer,char **buffer,size_t *currlen,size_t *maxlen,char *value,int flags,int min
          ,int max)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char **buffer_00;
  size_t *in_R8;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int cnt;
  size_t strln;
  int padlen;
  bool local_5e;
  bool local_5c;
  bool local_5a;
  size_t maxlen_00;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  size_t *local_30;
  
  iVar4 = 0;
  local_30 = in_R8;
  if (in_R8 == (size_t *)0x0) {
    local_30 = (size_t *)0x4ec4fa;
  }
  if (in_stack_00000010 < 0) {
    maxlen_00 = 0xffffffffffffffff;
  }
  else {
    maxlen_00 = (size_t)in_stack_00000010;
  }
  buffer_00 = (char **)OPENSSL_strnlen((char *)local_30,maxlen_00);
  iVar1 = in_stack_00000008 - (int)buffer_00;
  if ((in_stack_00000008 < 0) || (iVar1 < 0)) {
    iVar1 = 0;
  }
  if (-1 < in_stack_00000010) {
    if (in_stack_00000010 < 0x7fffffff - iVar1) {
      in_stack_00000010 = iVar1 + in_stack_00000010;
    }
    else {
      in_stack_00000010 = 0x7fffffff;
    }
  }
  if ((in_R9D & 1) != 0) {
    iVar1 = -iVar1;
  }
  while( true ) {
    local_5a = false;
    if (0 < iVar1) {
      local_5a = in_stack_00000010 < 0 || iVar4 < in_stack_00000010;
    }
    iVar2 = (int)(maxlen_00 >> 0x20);
    if (!local_5a) break;
    iVar2 = doapr_outch((char **)CONCAT44(in_R9D,iVar1),buffer_00,
                        (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),local_30,iVar2);
    if (iVar2 == 0) {
      return 0;
    }
    iVar1 = iVar1 + -1;
    iVar4 = iVar4 + 1;
  }
  while( true ) {
    local_5c = false;
    if (buffer_00 != (char **)0x0) {
      local_5c = in_stack_00000010 < 0 || iVar4 < in_stack_00000010;
    }
    if (!local_5c) break;
    iVar3 = doapr_outch((char **)CONCAT44(in_R9D,iVar1),buffer_00,
                        (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),local_30,iVar2);
    if (iVar3 == 0) {
      return 0;
    }
    buffer_00 = (char **)((long)buffer_00 + -1);
    iVar4 = iVar4 + 1;
  }
  while( true ) {
    local_5e = false;
    if (iVar1 < 0) {
      local_5e = in_stack_00000010 < 0 || iVar4 < in_stack_00000010;
    }
    if (!local_5e) break;
    iVar3 = doapr_outch((char **)CONCAT44(in_R9D,iVar1),buffer_00,
                        (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),local_30,iVar2);
    if (iVar3 == 0) {
      return 0;
    }
    iVar1 = iVar1 + 1;
    iVar4 = iVar4 + 1;
  }
  return 1;
}

Assistant:

static int
fmtstr(char **sbuffer,
       char **buffer,
       size_t *currlen,
       size_t *maxlen, const char *value, int flags, int min, int max)
{
    int padlen;
    size_t strln;
    int cnt = 0;

    if (value == 0)
        value = "<NULL>";

    strln = OPENSSL_strnlen(value, max < 0 ? SIZE_MAX : (size_t)max);

    padlen = min - strln;
    if (min < 0 || padlen < 0)
        padlen = 0;
    if (max >= 0) {
        /*
         * Calculate the maximum output including padding.
         * Make sure max doesn't overflow into negativity
         */
        if (max < INT_MAX - padlen)
            max += padlen;
        else
            max = INT_MAX;
    }
    if (flags & DP_F_MINUS)
        padlen = -padlen;

    while ((padlen > 0) && (max < 0 || cnt < max)) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ' '))
            return 0;
        --padlen;
        ++cnt;
    }
    while (strln > 0 && (max < 0 || cnt < max)) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, *value++))
            return 0;
        --strln;
        ++cnt;
    }
    while ((padlen < 0) && (max < 0 || cnt < max)) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ' '))
            return 0;
        ++padlen;
        ++cnt;
    }
    return 1;
}